

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBinFromMatArray::load
          (Mat *__return_storage_ptr__,ModelBinFromMatArray *this,int param_1,int param_2)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ModelBinFromMatArrayPrivate *pMVar5;
  Mat *pMVar6;
  Mat *m;
  
  pMVar5 = this->d;
  pMVar6 = pMVar5->weights;
  if (pMVar6 != (Mat *)0x0) {
    __return_storage_ptr__->data = pMVar6->data;
    piVar1 = pMVar6->refcount;
    __return_storage_ptr__->refcount = piVar1;
    __return_storage_ptr__->elemsize = pMVar6->elemsize;
    __return_storage_ptr__->elempack = pMVar6->elempack;
    __return_storage_ptr__->allocator = pMVar6->allocator;
    iVar2 = pMVar6->w;
    iVar3 = pMVar6->h;
    iVar4 = pMVar6->d;
    __return_storage_ptr__->dims = pMVar6->dims;
    __return_storage_ptr__->w = iVar2;
    __return_storage_ptr__->h = iVar3;
    __return_storage_ptr__->d = iVar4;
    __return_storage_ptr__->c = pMVar6->c;
    __return_storage_ptr__->cstep = pMVar6->cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      pMVar5 = this->d;
      pMVar6 = pMVar5->weights;
    }
    pMVar5->weights = pMVar6 + 1;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromMatArray::load(int /*w*/, int /*type*/) const
{
    if (!d->weights)
        return Mat();

    Mat m = d->weights[0];
    d->weights++;
    return m;
}